

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O2

long miniminer_tests::Find<COutPoint,long>
               (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                *map,COutPoint *key)

{
  const_iterator cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  check_type cVar2;
  char *local_d8;
  char *local_d0;
  lazy_ostream local_c8;
  undefined1 *local_b8;
  string *local_b0;
  assertion_result local_a8;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
          ::find(&map->_M_t,key);
  local_90._16_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_90._24_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
       + 0x68;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
  local_90._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_90._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x47;
  file.m_begin = local_90 + 0x10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)args,msg);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((_Rb_tree_header *)cVar1._M_node != &(map->_M_t)._M_impl.super__Rb_tree_header);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  COutPoint::ToString_abi_cxx11_(&local_70,key);
  tinyformat::format<std::__cxx11::string>
            (&local_50,(tinyformat *)"Cannot find %s",(char *)&local_70,args);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139e30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_d0 = "";
  local_b0 = &local_50;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_c8,1,1,WARN,_cVar2,(size_t)&local_d8,0x47);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (long)cVar1._M_node[2]._M_parent;
  }
  __stack_chk_fail();
}

Assistant:

Value Find(const std::map<Key, Value>& map, const Key& key)
{
    auto it = map.find(key);
    BOOST_CHECK_MESSAGE(it != map.end(), strprintf("Cannot find %s", key.ToString()));
    return it->second;
}